

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O2

DEFBUF * defendel(Global *global,char *name,int delete)

{
  int iVar1;
  DEFBUF *ptr;
  long lVar2;
  DEFBUF *pDVar3;
  long lVar4;
  uintptr_t uVar5;
  long lVar6;
  
  lVar6 = 0x2000000000;
  lVar2 = 0;
  for (lVar4 = 0; (long)name[lVar4] != 0; lVar4 = lVar4 + 1) {
    lVar2 = lVar2 + name[lVar4];
    lVar6 = lVar6 + 0x100000000;
  }
  uVar5 = lVar4 + lVar2;
  ptr = (DEFBUF *)(global->symtab + ((uint)uVar5 & 0x3f));
  do {
    do {
      pDVar3 = ptr;
      ptr = pDVar3->link;
      if (ptr == (DEFBUF *)0x0) goto LAB_001062f0;
    } while (uVar5 != ptr->hash);
    iVar1 = strcmp(ptr->name,name);
  } while (iVar1 < 0);
  if (iVar1 == 0) {
    pDVar3->link = ptr->link;
    if (ptr->repl != (char *)0x0) {
      Free(ptr->repl);
    }
    Free(ptr);
  }
  else {
LAB_001062f0:
    ptr = (DEFBUF *)0x0;
  }
  if (delete == 0) {
    ptr = (DEFBUF *)Getmem(global,lVar6 >> 0x20);
    ptr->link = pDVar3->link;
    pDVar3->link = ptr;
    ptr->hash = uVar5;
    ptr->repl = (char *)0x0;
    ptr->nargs = 0;
    strcpy(ptr->name,name);
  }
  return ptr;
}

Assistant:

DEFBUF *defendel(struct Global *global,
		 char *name,
		 int delete) 		/* TRUE to delete a symbol */
{
  /*
   * Enter this name in the lookup table (delete = FALSE)
   * or delete this name (delete = TRUE).
   * Returns a pointer to the define block (delete = FALSE)
   * Returns NULL if the symbol wasn't defined (delete = TRUE).
   */

  DEFBUF *dp;
  DEFBUF **prevp;
  char *np;
  uintptr_t nhash;
  int temp;
  size_t size;
  
  for (nhash = 0, np = name; *np != EOS;)
    nhash += *np++;
  size = (np - name);
  nhash += size;
  prevp = &global->symtab[nhash % SBSIZE];
  while ((dp = *prevp) != (DEFBUF *) NULL) {
    if (dp->hash == nhash
	&& (temp = strcmp(dp->name, name)) >= 0) {
      if (temp > 0)
	dp = NULL;			/* Not found		*/
      else {
	*prevp = dp->link;		/* Found, unlink and	*/
	if (dp->repl != NULL)       	/* Free the replacement */
	  Freemem(dp->repl);         	/* if any, and then     */
	Freemem((char *) dp);          	/* Free the symbol      */
      }
      break;
    }
    prevp = &dp->link;
  }
  if (!delete) {
    dp = (DEFBUF *) Getmem(global, (int) (sizeof (DEFBUF) + size));
    dp->link = *prevp;
    *prevp = dp;
    dp->hash = nhash;
    dp->repl = NULL;
    dp->nargs = 0;
    strcpy(dp->name, name);
  }
  return(dp);
}